

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  sqlite3_uint64 n;
  double dVar1;
  int errCode;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  uint *local_80;
  sqlite3_int64 nRow;
  int nInst;
  void *local_68;
  Fts5ExtensionApi *local_60;
  sqlite3_int64 nToken;
  int io;
  int local_44;
  sqlite3_context *local_40;
  sqlite3_value **local_38;
  
  nInst = 0;
  local_44 = nVal;
  local_40 = pCtx;
  local_38 = apVal;
  local_80 = (uint *)(*pApi->xGetAuxdata)(pFts,0);
  local_60 = pApi;
  if (local_80 == (uint *)0x0) {
    nRow = 0;
    nToken = 0;
    uVar2 = (*pApi->xPhraseCount)(pFts);
    n = (long)(int)(uVar2 * 2) * 8 + 0x20;
    local_80 = (uint *)sqlite3_malloc64(n);
    if (local_80 == (uint *)0x0) {
      errCode = 7;
    }
    else {
      memset(local_80,0,n);
      *local_80 = uVar2;
      *(uint **)(local_80 + 4) = local_80 + 8;
      *(uint **)(local_80 + 6) = local_80 + (long)(int)uVar2 * 2 + 8;
      errCode = (*pApi->xRowCount)(pFts,&nRow);
      if ((errCode == 0) && (errCode = (*pApi->xColumnTotalSize)(pFts,-1,&nToken), errCode == 0)) {
        *(double *)(local_80 + 2) = (double)nToken / (double)nRow;
        errCode = 0;
      }
    }
    for (lVar6 = 0; (pApi = local_60, errCode == 0 && (lVar6 < (int)uVar2)); lVar6 = lVar6 + 1) {
      _io = 0;
      errCode = (*local_60->xQueryPhrase)(pFts,(int)lVar6,&io,fts5CountCb);
      if (errCode == 0) {
        dVar7 = log(((double)(nRow - _io) + 0.5) / ((double)_io + 0.5));
        *(ulong *)(*(long *)(local_80 + 4) + lVar6 * 8) =
             ~-(ulong)(0.0 < dVar7) & 0x3eb0c6f7a0b5ed8d | (ulong)dVar7 & -(ulong)(0.0 < dVar7);
      }
    }
    if (errCode == 0) {
      errCode = (*local_60->xSetAuxdata)(pFts,local_80,sqlite3_free);
      if (errCode == 0) goto LAB_001c182a;
    }
    else {
      sqlite3_free(local_80);
    }
    local_80 = (uint *)0x0;
    local_68 = (void *)0x0;
  }
  else {
LAB_001c182a:
    local_68 = *(void **)(local_80 + 6);
    memset(local_68,0,(long)(int)*local_80 << 3);
    errCode = (*pApi->xInstCount)(pFts,&nInst);
  }
  for (iVar5 = 0; (errCode == 0 && (iVar5 < nInst)); iVar5 = iVar5 + 1) {
    errCode = (*local_60->xInst)(pFts,iVar5,(int *)&nRow,(int *)&nToken,&io);
    if (errCode == 0) {
      dVar7 = 1.0;
      if ((int)nToken < local_44) {
        dVar7 = sqlite3VdbeRealValue(local_38[(int)nToken]);
      }
      *(double *)((long)local_68 + (long)(int)nRow * 8) =
           dVar7 + *(double *)((long)local_68 + (long)(int)nRow * 8);
    }
  }
  if ((errCode == 0) && (errCode = (*local_60->xColumnSize)(pFts,-1,(int *)&nRow), errCode == 0)) {
    uVar4 = 0;
    uVar3 = (ulong)*local_80;
    if ((int)*local_80 < 1) {
      uVar3 = uVar4;
    }
    dVar7 = 0.0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dVar1 = *(double *)((long)local_68 + uVar4 * 8);
      dVar7 = dVar7 + ((dVar1 * 2.2) /
                      ((((double)(int)nRow * 0.75) / *(double *)(local_80 + 2) + 0.25) * 1.2 + dVar1
                      )) * *(double *)(*(long *)(local_80 + 4) + uVar4 * 8);
    }
    sqlite3_result_double(local_40,-dVar7);
  }
  else {
    sqlite3_result_error_code(local_40,errCode);
  }
  return;
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc = SQLITE_OK;             /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine the BM25 score for the current row. */
  for(i=0; rc==SQLITE_OK && i<pData->nPhrase; i++){
    score += pData->aIDF[i] * (
      ( aFreq[i] * (k1 + 1.0) ) / 
      ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
    );
  }
  
  /* If no error has occurred, return the calculated score. Otherwise,
  ** throw an SQL exception.  */
  if( rc==SQLITE_OK ){
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}